

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O0

ReadState __thiscall
CombinedH264Reader::detectStreamByNal(CombinedH264Reader *this,uint8_t *data,uint8_t *dataEnd)

{
  int iVar1;
  undefined1 local_438 [4];
  int rez;
  SEIUnit sei;
  PPSUnit pps;
  undefined1 local_230 [8];
  SPSUnit sps;
  NALType nalType;
  uint8_t *dataEnd_local;
  uint8_t *data_local;
  CombinedH264Reader *this_local;
  
  sps.view_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = *data & 0x1f;
  switch(sps.view_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_) {
  case 6:
    SEIUnit::SEIUnit((SEIUnit *)local_438);
    NALUnit::decodeBuffer((NALUnit *)local_438,data,dataEnd);
    iVar1 = SEIUnit::isMVCSEI((SEIUnit *)local_438);
    if (iVar1 == -10) {
      this_local._4_4_ = NeedMoreData;
    }
    else if (iVar1 == 0) {
      this_local._4_4_ = Primary;
    }
    else {
      this_local._4_4_ = Secondary;
    }
    SEIUnit::~SEIUnit((SEIUnit *)local_438);
    break;
  default:
    this_local._4_4_ = Primary;
    break;
  case 8:
    PPSUnit::PPSUnit((PPSUnit *)&sei.m_mvcHeaderStart);
    NALUnit::decodeBuffer((NALUnit *)&sei.m_mvcHeaderStart,data,dataEnd);
    iVar1 = PPSUnit::deserialize((PPSUnit *)&sei.m_mvcHeaderStart);
    if (iVar1 == -10) {
      this_local._4_4_ = NeedMoreData;
    }
    else if (pps.super_NALUnit.bitReader.m_bitLeft == this->m_mvcSPS) {
      this_local._4_4_ = Secondary;
    }
    else {
      this_local._4_4_ = Primary;
    }
    PPSUnit::~PPSUnit((PPSUnit *)&sei.m_mvcHeaderStart);
    break;
  case 10:
    this_local._4_4_ = Both;
    break;
  case 0xf:
    SPSUnit::SPSUnit((SPSUnit *)local_230);
    NALUnit::decodeBuffer((NALUnit *)local_230,data,dataEnd);
    iVar1 = SPSUnit::deserialize((SPSUnit *)local_230);
    if (iVar1 == -10) {
      this_local._4_4_ = NeedMoreData;
    }
    else {
      this->m_mvcSPS =
           (uint)sps.level_idc_ext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      this_local._4_4_ = Secondary;
    }
    SPSUnit::~SPSUnit((SPSUnit *)local_230);
    break;
  case 0x14:
  case 0x18:
    this_local._4_4_ = Secondary;
  }
  return this_local._4_4_;
}

Assistant:

CombinedH264Reader::ReadState CombinedH264Reader::detectStreamByNal(const uint8_t* data, const uint8_t* dataEnd)
{
    const auto nalType = static_cast<NALUnit::NALType>(*data & 0x1f);

    switch (nalType)
    {
    case NALUnit::NALType::nuEOSeq:
        return ReadState::Both;
    case NALUnit::NALType::nuDRD:
    case NALUnit::NALType::nuSliceExt:
        return ReadState::Secondary;

    case NALUnit::NALType::nuSubSPS:
    {
        SPSUnit sps;
        sps.decodeBuffer(data, dataEnd);
        if (sps.deserialize() == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        m_mvcSPS = sps.seq_parameter_set_id;
        return ReadState::Secondary;
    }
    case NALUnit::NALType::nuPPS:
    {
        PPSUnit pps;
        pps.decodeBuffer(data, dataEnd);
        if (pps.deserialize() == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        if (pps.seq_parameter_set_id == m_mvcSPS)
            return ReadState::Secondary;
        return ReadState::Primary;
    }
    case NALUnit::NALType::nuSEI:
    {
        SEIUnit sei;
        sei.decodeBuffer(data, dataEnd);
        const int rez = sei.isMVCSEI();
        if (rez == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        if (rez == 0)
            return ReadState::Primary;
        return ReadState::Secondary;
    }
    default:
        return ReadState::Primary;
    }
}